

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceGLImpl::OnReleaseTexture(RenderDeviceGLImpl *this,ITexture *pTexture)

{
  bool bVar1;
  reference ppVar2;
  pair<__GLXcontextRec_*const,_Diligent::FBOCache> *FBOCacheIt;
  iterator __end1;
  iterator __begin1;
  unordered_map<__GLXcontextRec_*,_Diligent::FBOCache,_std::hash<__GLXcontextRec_*>,_std::equal_to<__GLXcontextRec_*>,_std::allocator<std::pair<__GLXcontextRec_*const,_Diligent::FBOCache>_>_>
  *__range1;
  SpinLockGuard FBOCacheGuard;
  ITexture *pTexture_local;
  RenderDeviceGLImpl *this_local;
  
  FBOCacheGuard._M_device = (mutex_type *)pTexture;
  std::lock_guard<Threading::SpinLock>::lock_guard
            ((lock_guard<Threading::SpinLock> *)&__range1,&this->m_FBOCacheLock);
  __end1 = std::
           unordered_map<__GLXcontextRec_*,_Diligent::FBOCache,_std::hash<__GLXcontextRec_*>,_std::equal_to<__GLXcontextRec_*>,_std::allocator<std::pair<__GLXcontextRec_*const,_Diligent::FBOCache>_>_>
           ::begin(&this->m_FBOCache);
  FBOCacheIt = (pair<__GLXcontextRec_*const,_Diligent::FBOCache> *)
               std::
               unordered_map<__GLXcontextRec_*,_Diligent::FBOCache,_std::hash<__GLXcontextRec_*>,_std::equal_to<__GLXcontextRec_*>,_std::allocator<std::pair<__GLXcontextRec_*const,_Diligent::FBOCache>_>_>
               ::end(&this->m_FBOCache);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<__GLXcontextRec_*const,_Diligent::FBOCache>,_false>
                       ,(_Node_iterator_base<std::pair<__GLXcontextRec_*const,_Diligent::FBOCache>,_false>
                         *)&FBOCacheIt);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<__GLXcontextRec_*const,_Diligent::FBOCache>,_false,_false>::
             operator*(&__end1);
    FBOCache::OnReleaseTexture(&ppVar2->second,(ITexture *)FBOCacheGuard._M_device);
    std::__detail::
    _Node_iterator<std::pair<__GLXcontextRec_*const,_Diligent::FBOCache>,_false,_false>::operator++
              (&__end1);
  }
  std::lock_guard<Threading::SpinLock>::~lock_guard((lock_guard<Threading::SpinLock> *)&__range1);
  return;
}

Assistant:

void RenderDeviceGLImpl::OnReleaseTexture(ITexture* pTexture)
{
    Threading::SpinLockGuard FBOCacheGuard{m_FBOCacheLock};
    for (auto& FBOCacheIt : m_FBOCache)
        FBOCacheIt.second.OnReleaseTexture(pTexture);
}